

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uchar *puVar14;
  int local_50;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar11 = *(int *)((long)&pjVar1[3].start_pass + 4);
    if (iVar11 == 0) {
      process_restart(cinfo);
      iVar11 = *(int *)((long)&pjVar1[3].start_pass + 4);
    }
    *(int *)((long)&pjVar1[3].start_pass + 4) = iVar11 + -1;
  }
  if ((pjVar1[1].insufficient_data != -1) && (iVar11 = cinfo->Ss, iVar11 <= cinfo->Se)) {
    paJVar2 = *MCU_data;
    lVar7 = (long)cinfo->cur_comp_info[0]->ac_tbl_no;
    do {
      lVar8 = *(long *)(&pjVar1[8].insufficient_data + lVar7 * 2);
      lVar13 = (long)(iVar11 * 3 + -3);
      iVar4 = arith_decode(cinfo,(uchar *)(lVar8 + lVar13));
      if (iVar4 != 0) {
        return 1;
      }
      puVar14 = (uchar *)(lVar13 + lVar8 + 2);
      lVar8 = 0;
      while (iVar4 = arith_decode(cinfo,puVar14 + -1), iVar4 == 0) {
        puVar14 = puVar14 + 3;
        lVar8 = lVar8 + 1;
        if (cinfo->Se <= iVar11 + -1 + (int)lVar8) goto LAB_0012c05a;
      }
      iVar4 = arith_decode(cinfo,(uchar *)(pjVar1 + 0xe));
      iVar5 = arith_decode(cinfo,puVar14);
      local_50 = iVar11 + (int)lVar8;
      if (iVar5 == 0) {
        uVar12 = 0;
      }
      else {
        iVar5 = arith_decode(cinfo,puVar14);
        if (iVar5 == 0) {
          uVar12 = 1;
        }
        else {
          lVar13 = *(long *)(&pjVar1[8].insufficient_data + lVar7 * 2);
          lVar10 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[lVar7] < local_50) {
            lVar10 = 0xd9;
          }
          puVar14 = (uchar *)(lVar13 + lVar10);
          iVar5 = arith_decode(cinfo,puVar14);
          if (iVar5 == 0) {
            puVar14 = puVar14 + 0xe;
            uVar12 = 2;
            uVar9 = uVar12;
          }
          else {
            puVar14 = (uchar *)(lVar13 + lVar10 + 0xe);
            uVar12 = 2;
            do {
              uVar12 = uVar12 * 2;
              if (uVar12 == 0x8000) {
LAB_0012c05a:
                pjVar3 = cinfo->err;
                pjVar3->msg_code = 0x7e;
                (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
                pjVar1[1].insufficient_data = -1;
                return 1;
              }
              iVar5 = arith_decode(cinfo,puVar14 + -0xd);
              puVar14 = puVar14 + 1;
            } while (iVar5 != 0);
            uVar9 = uVar12;
            if (uVar12 == 0) {
              uVar12 = 0;
              goto LAB_0012c007;
            }
          }
          do {
            uVar9 = (int)uVar9 >> 1;
            uVar6 = arith_decode(cinfo,puVar14);
            if (uVar6 != 0) {
              uVar6 = uVar9;
            }
            uVar12 = uVar12 | uVar6;
          } while (1 < uVar9);
        }
      }
LAB_0012c007:
      uVar9 = ~uVar12;
      if (iVar4 == 0) {
        uVar9 = uVar12 + 1;
      }
      (*paJVar2)[jpeg_natural_order[iVar11 + lVar8]] = (JCOEF)(uVar9 << ((byte)cinfo->Al & 0x1f));
      iVar11 = iVar11 + (int)lVar8 + 1;
    } while (local_50 < cinfo->Se);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;         /* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1;  if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[jpeg_natural_order[k]] = (JCOEF)((unsigned)v << cinfo->Al);
  }

  return TRUE;
}